

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateMetadataPragma
          (FileGenerator *this,Printer *p,string_view info_path)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined1 auVar1 [8];
  bool bVar2;
  ulong uVar3;
  Sub *local_388;
  basic_string_view<char,_std::char_traits<char>_> local_338;
  undefined1 local_322;
  allocator<char> local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_299;
  string local_298;
  Sub *local_278;
  Sub local_270;
  Sub local_1b8;
  Sub local_100;
  iterator local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_38;
  undefined1 local_28 [8];
  Printer *p_local;
  FileGenerator *this_local;
  string_view info_path_local;
  
  info_path_local._M_len = (size_t)info_path._M_str;
  this_local = (FileGenerator *)info_path._M_len;
  local_28 = (undefined1  [8])p;
  p_local = (Printer *)this;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (((!bVar2) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) &&
     (uVar3 = std::__cxx11::string::empty(), auVar1 = local_28, (uVar3 & 1) == 0)) {
    local_322 = 1;
    local_278 = &local_270;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"guard",&local_299);
    io::Printer::Sub::Sub<std::__cxx11::string&>
              (&local_270,&local_298,&(this->options_).annotation_guard_name);
    local_278 = &local_1b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"pragma",&local_2d1);
    io::Printer::Sub::Sub<std::__cxx11::string&>
              (&local_1b8,&local_2d0,&(this->options_).annotation_pragma_name);
    local_278 = &local_100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"info_path",&local_2f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_320,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               &local_321);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_100,&local_2f8,&local_320);
    local_322 = 0;
    local_48 = &local_270;
    local_40 = 3;
    v._M_len = 3;
    v._M_array = local_48;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_38._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_338,
               "\n        #ifdef $guard$\n        #pragma $pragma$ \"$info_path$\"\n        #endif  // $guard$\n      "
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (auVar1,local_38._M_allocated_capacity,local_38._8_8_,local_338._M_len,
               local_338._M_str);
    local_388 = (Sub *)&local_48;
    do {
      local_388 = local_388 + -1;
      io::Printer::Sub::~Sub(local_388);
    } while (local_388 != &local_270);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
  }
  return;
}

Assistant:

void FileGenerator::GenerateMetadataPragma(io::Printer* p,
                                           absl::string_view info_path) {
  if (info_path.empty() || options_.annotation_pragma_name.empty() ||
      options_.annotation_guard_name.empty()) {
    return;
  }

  p->Emit(
      {
          {"guard", options_.annotation_guard_name},
          {"pragma", options_.annotation_pragma_name},
          {"info_path", std::string(info_path)},
      },
      R"(
        #ifdef $guard$
        #pragma $pragma$ "$info_path$"
        #endif  // $guard$
      )");
}